

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O3

void __thiscall
capnp::Orphan<capnp::DynamicValue>::Orphan
          (Orphan<capnp::DynamicValue> *this,Builder *value,OrphanBuilder *builder)

{
  Type TVar1;
  CapTableBuilder *pCVar2;
  char *pcVar3;
  size_t sVar4;
  
  TVar1 = value->type;
  this->type = TVar1;
  pCVar2 = builder->capTable;
  (this->builder).segment = builder->segment;
  (this->builder).capTable = pCVar2;
  (this->builder).location = builder->location;
  (this->builder).tag.content = (builder->tag).content;
  builder->segment = (SegmentBuilder *)0x0;
  builder->location = (word *)0x0;
  switch(TVar1) {
  case BOOL:
    (this->field_1).boolValue = (value->field_1).boolValue;
    return;
  case INT:
  case UINT:
  case STRUCT:
    sVar4 = (value->field_1).intValue;
    break;
  case FLOAT:
    (this->field_1).intValue = (value->field_1).intValue;
    return;
  default:
    goto switchD_001928c1_caseD_6;
  case LIST:
    pcVar3 = (value->field_1).textValue.content.ptr;
    (this->field_1).intValue = (value->field_1).intValue;
    *(char **)((long)&this->field_1 + 8) = pcVar3;
    return;
  case ENUM:
    (this->field_1).enumValue.value =
         *(uint16_t *)&(value->field_1).listValue.schema.elementType.field_4;
    (this->field_1).intValue = (value->field_1).intValue;
    return;
  case CAPABILITY:
    sVar4 = (value->field_1).textValue.content.size_;
  }
  (this->field_1).intValue = sVar4;
switchD_001928c1_caseD_6:
  return;
}

Assistant:

inline Type getType() { return type; }